

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O3

REF_STATUS ref_edge_ghost_glob(REF_EDGE ref_edge,REF_MPI ref_mpi,REF_GLOB *data)

{
  REF_NODE pRVar1;
  REF_MPI pRVar2;
  void *__ptr;
  uint uVar3;
  REF_INT *send_size;
  REF_INT *recv_size;
  long lVar4;
  REF_INT *pRVar5;
  void *pvVar6;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  uint uVar13;
  size_t __size;
  uint uVar14;
  ulong uVar15;
  REF_INT node1;
  REF_INT node0;
  uint local_a8;
  int local_a4;
  REF_NODE local_a0;
  REF_INT *local_98;
  REF_MPI local_90;
  void *local_88;
  void *local_80;
  ulong local_78;
  uint local_6c;
  REF_INT local_68;
  REF_INT local_64;
  ulong local_60;
  undefined4 *local_58;
  void *local_50;
  REF_GLOB *local_48;
  ulong local_40;
  void *local_38;
  
  if ((long)ref_mpi->n < 2) {
    return 0;
  }
  pRVar1 = ref_edge->node;
  __size = (long)ref_mpi->n << 2;
  send_size = (REF_INT *)calloc(1,__size);
  if (send_size == (REF_INT *)0x0) {
    pcVar12 = "malloc a_size of REF_INT NULL";
    uVar8 = 0x113;
    goto LAB_0013f7da;
  }
  local_90 = ref_mpi;
  recv_size = (REF_INT *)calloc(1,__size);
  if (recv_size == (REF_INT *)0x0) {
    pcVar12 = "malloc b_size of REF_INT NULL";
    uVar8 = 0x114;
    goto LAB_0013f7da;
  }
  iVar7 = ref_edge->n;
  local_a0 = pRVar1;
  local_48 = data;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  else {
    uVar3 = local_90->id;
    iVar9 = 0;
    local_98 = recv_size;
    do {
      ref_edge_part(ref_edge,iVar9,(REF_INT *)&local_a8);
      if (local_a8 != uVar3) {
        send_size[(int)local_a8] = send_size[(int)local_a8] + 1;
      }
      iVar9 = iVar9 + 1;
      recv_size = local_98;
    } while (iVar7 != iVar9);
  }
  pRVar2 = local_90;
  local_a4 = iVar7;
  uVar3 = ref_mpi_alltoall(local_90,send_size,recv_size,1);
  if (uVar3 != 0) {
    pcVar12 = "alltoall sizes";
    uVar8 = 0x11c;
LAB_0013f82f:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar8,
           "ref_edge_ghost_glob",(ulong)uVar3,pcVar12);
    return uVar3;
  }
  uVar3 = pRVar2->n;
  lVar10 = (long)(int)uVar3;
  if (lVar10 < 1) {
    uVar13 = 0;
  }
  else {
    lVar4 = 0;
    uVar13 = 0;
    do {
      uVar13 = uVar13 + send_size[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar10 != lVar4);
    if ((int)uVar13 < 0) {
      pcVar12 = "malloc a_nodes of REF_GLOB negative";
      uVar8 = 0x120;
      goto LAB_0013f88c;
    }
  }
  pRVar5 = (REF_INT *)malloc((ulong)(uVar13 * 2) << 3);
  if (pRVar5 == (REF_INT *)0x0) {
    pcVar12 = "malloc a_nodes of REF_GLOB NULL";
    uVar8 = 0x120;
  }
  else {
    uVar15 = (ulong)uVar13;
    local_98 = pRVar5;
    pvVar6 = malloc(uVar15 * 8);
    if (pvVar6 == (void *)0x0) {
      pcVar12 = "malloc a_data of REF_GLOB NULL";
      uVar8 = 0x121;
      goto LAB_0013f7da;
    }
    local_40 = uVar15;
    local_38 = pvVar6;
    pvVar6 = malloc(uVar15 * 4);
    if (pvVar6 == (void *)0x0) {
      pcVar12 = "malloc a_edge of REF_INT NULL";
      uVar8 = 0x122;
      goto LAB_0013f7da;
    }
    if ((int)uVar3 < 1) {
      uVar14 = 0;
    }
    else {
      lVar4 = 0;
      uVar14 = 0;
      do {
        uVar14 = uVar14 + recv_size[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar10 != lVar4);
      if ((int)uVar14 < 0) {
        pcVar12 = "malloc b_nodes of REF_GLOB negative";
        uVar8 = 0x126;
        goto LAB_0013f88c;
      }
    }
    local_50 = pvVar6;
    pvVar6 = malloc((ulong)(uVar14 * 2) << 3);
    if (pvVar6 == (void *)0x0) {
      pcVar12 = "malloc b_nodes of REF_GLOB NULL";
      uVar8 = 0x126;
    }
    else {
      local_60 = (ulong)uVar14;
      local_88 = pvVar6;
      pvVar6 = malloc(local_60 * 8);
      if (pvVar6 == (void *)0x0) {
        pcVar12 = "malloc b_data of REF_GLOB NULL";
        uVar8 = 0x127;
      }
      else {
        if ((int)uVar3 < 0) {
          pcVar12 = "malloc a_next of REF_INT negative";
          uVar8 = 0x129;
LAB_0013f88c:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 uVar8,"ref_edge_ghost_glob",pcVar12);
          return 1;
        }
        local_80 = pvVar6;
        local_58 = (undefined4 *)malloc(lVar10 * 4);
        if (local_58 != (undefined4 *)0x0) {
          *local_58 = 0;
          local_a8 = 1;
          if (1 < uVar3) {
            lVar4 = 0;
            iVar7 = 0;
            do {
              iVar7 = iVar7 + send_size[lVar4];
              local_58[lVar4 + 1] = iVar7;
              lVar4 = lVar4 + 1;
              local_a8 = uVar3;
            } while (lVar10 + -1 != lVar4);
          }
          if ((long)ref_edge->n < 1) {
            uVar15 = 0;
          }
          else {
            local_6c = local_90->id;
            uVar11 = 0;
            local_78 = (long)ref_edge->n;
            do {
              ref_edge_part(ref_edge,(REF_INT)uVar11,(REF_INT *)&local_a8);
              if (local_a8 != local_6c) {
                iVar7 = local_58[(int)local_a8];
                *(REF_INT *)((long)local_50 + (long)iVar7 * 4) = (REF_INT)uVar11;
                pRVar5 = ref_edge->e2n;
                iVar9 = pRVar5[uVar11 * 2];
                lVar4 = -1;
                lVar10 = -1;
                if (((-1 < (long)iVar9) && (iVar9 < local_a0->max)) &&
                   (lVar10 = local_a0->global[iVar9], lVar10 < 0)) {
                  lVar10 = -1;
                }
                *(long *)(local_98 + (long)iVar7 * 4) = lVar10;
                iVar9 = pRVar5[uVar11 * 2 + 1];
                if (((-1 < (long)iVar9) && (iVar9 < local_a0->max)) &&
                   (lVar4 = local_a0->global[iVar9], lVar4 < 0)) {
                  lVar4 = -1;
                }
                *(long *)(local_98 + (long)(int)(iVar7 * 2 | 1) * 2) = lVar4;
                local_58[(int)local_a8] = iVar7 + 1;
              }
              uVar11 = uVar11 + 1;
              uVar15 = local_78;
            } while (local_78 != uVar11);
          }
          local_a4 = (int)uVar15;
          uVar3 = ref_mpi_alltoallv(local_90,local_98,send_size,local_88,recv_size,2,2);
          if (uVar3 == 0) {
            if (uVar14 != 0) {
              local_60 = local_60 << 3;
              uVar15 = 0;
              do {
                uVar3 = ref_node_local(local_a0,*(REF_GLOB *)((long)local_88 + uVar15 * 2),&local_64
                                      );
                if (uVar3 != 0) {
                  pcVar12 = "loc 0";
                  uVar8 = 0x13f;
                  goto LAB_0013f82f;
                }
                local_78 = uVar15;
                uVar3 = ref_node_local(local_a0,*(REF_GLOB *)((long)local_88 + uVar15 * 2 + 8),
                                       &local_68);
                if (uVar3 != 0) {
                  pcVar12 = "loc 1";
                  uVar8 = 0x140;
                  goto LAB_0013f82f;
                }
                uVar3 = ref_edge_with(ref_edge,local_64,local_68,&local_a4);
                if (uVar3 != 0) {
                  pcVar12 = "find edge";
                  uVar8 = 0x141;
                  goto LAB_0013f82f;
                }
                *(REF_GLOB *)((long)local_80 + local_78) = local_48[local_a4];
                uVar15 = local_78 + 8;
              } while (local_60 != uVar15);
            }
            __ptr = local_38;
            uVar3 = ref_mpi_alltoallv(local_90,local_80,recv_size,local_38,send_size,1,2);
            pvVar6 = local_50;
            if (uVar3 == 0) {
              if (uVar13 != 0) {
                uVar15 = 0;
                do {
                  local_48[*(int *)((long)local_50 + uVar15 * 4)] =
                       *(REF_GLOB *)((long)__ptr + uVar15 * 8);
                  uVar15 = uVar15 + 1;
                } while (local_40 != uVar15);
              }
              free(local_58);
              free(local_80);
              free(local_88);
              free(pvVar6);
              free(__ptr);
              free(local_98);
              free(recv_size);
              free(send_size);
              return 0;
            }
            pcVar12 = "alltoallv return data";
            uVar8 = 0x147;
          }
          else {
            pcVar12 = "alltoallv requested nodes";
            uVar8 = 0x13c;
          }
          goto LAB_0013f82f;
        }
        pcVar12 = "malloc a_next of REF_INT NULL";
        uVar8 = 0x129;
      }
    }
  }
LAB_0013f7da:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar8,
         "ref_edge_ghost_glob",pcVar12);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_edge_ghost_glob(REF_EDGE ref_edge, REF_MPI ref_mpi,
                                       REF_GLOB *data) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT edge;
  REF_INT part;
  REF_INT *a_next, *a_edge;
  REF_GLOB *a_nodes, *b_nodes;
  REF_GLOB *a_data, *b_data;

  REF_INT node0, node1;
  REF_INT request;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) a_size[part]++;
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_nodes, 2 * a_total, REF_GLOB);
  ref_malloc(a_data, a_total, REF_GLOB);
  ref_malloc(a_edge, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_nodes, 2 * b_total, REF_GLOB);
  ref_malloc(b_data, b_total, REF_GLOB);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) {
      a_edge[a_next[part]] = edge;
      a_nodes[0 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, edge));
      a_nodes[1 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, edge));
      (a_next[part])++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_nodes, a_size, b_nodes, b_size, 2,
                        REF_GLOB_TYPE),
      "alltoallv requested nodes");

  for (request = 0; request < b_total; request++) {
    RSS(ref_node_local(ref_node, b_nodes[0 + 2 * request], &node0), "loc 0");
    RSS(ref_node_local(ref_node, b_nodes[1 + 2 * request], &node1), "loc 1");
    RSS(ref_edge_with(ref_edge, node0, node1, &edge), "find edge");
    b_data[request] = data[edge];
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_data, b_size, a_data, a_size, 1,
                        REF_GLOB_TYPE),
      "alltoallv return data");

  for (request = 0; request < a_total; request++) {
    data[a_edge[request]] = a_data[request];
  }

  ref_free(a_next);

  ref_free(b_data);
  ref_free(b_nodes);

  ref_free(a_edge);

  ref_free(a_data);
  ref_free(a_nodes);

  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}